

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::write<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,char8_t *s,
          basic_format_specs<char8_t> *specs,locale_ref param_4)

{
  bool bVar1;
  char8_t *pcVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar3;
  locale_ref in_R9;
  basic_string_view<char8_t> s_00;
  error_handler local_19;
  
  bVar1 = check_cstring_type_spec<fmt::v8::detail::error_handler>(specs->type,&local_19);
  if (bVar1) {
    pcVar2 = (char8_t *)std::char_traits<char8_t>::length(s);
    s_00.size_ = (size_t)specs;
    s_00.data_ = pcVar2;
    bVar3 = write<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                      (out.container,(back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)s,s_00
                       ,(basic_format_specs<char8_t> *)0x0,in_R9);
  }
  else {
    bVar3 = write_ptr<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>
                      (out,(unsigned_long)s,specs);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  return check_cstring_type_spec(specs.type)
             ? write(out, basic_string_view<Char>(s), specs, {})
             : write_ptr<Char>(out, to_uintptr(s), &specs);
}